

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

uint * ON_BinarySearchUnsignedIntArray(uint key,uint *base,size_t nel)

{
  ulong uVar1;
  
  if ((base != (uint *)0x0 && nel != 0) && (*base <= key)) {
    if (*base == key) {
      return base;
    }
    if (key <= base[nel - 1]) {
      if (base[nel - 1] == key) {
        return base + (nel - 1);
      }
      while (uVar1 = nel, uVar1 != 0) {
        nel = uVar1 >> 1;
        if (base[nel] <= key) {
          if (key <= base[nel]) {
            return base + nel;
          }
          base = base + nel + 1;
          nel = uVar1 - (nel + 1);
        }
      }
    }
  }
  return (uint *)0x0;
}

Assistant:

const unsigned int* ON_BinarySearchUnsignedIntArray( unsigned int key, const unsigned int* base, size_t nel )
{
  if (nel > 0 && base )
  {
    size_t i;
    unsigned int d;

    // The end tests are not necessary, but they
    // seem to provide overall speed improvement
    // for the types of searches that call this
    // function.
    d = base[0];
    if ( key < d )
      return 0;
    if ( key == d )
      return base;

    d = base[nel-1];
    if ( key > d )
      return 0;
    if ( key == d )
      return (base + (nel-1));

    while ( nel > 0 )
    {
      i = nel/2;
      d = base[i];
      if ( key < d )
      {
        nel = i;
      }
      else if ( key > d )
      {
        i++;
        base += i;
        nel -= i;
      }
      else
      {
        return base+i;
      }
    }
  }
  return 0;
}